

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodemv.c
# Opt level: O3

void read_filter_intra_mode_info(AV1_COMMON *cm,MACROBLOCKD *xd,aom_reader *r)

{
  aom_cdf_prob *icdf;
  ushort uVar1;
  ushort uVar2;
  MB_MODE_INFO *pMVar3;
  FRAME_CONTEXT *pFVar4;
  short sVar5;
  uint8_t uVar6;
  int iVar7;
  ulong uVar8;
  byte bVar9;
  long lVar10;
  aom_cdf_prob (*icdf_00) [3];
  
  pMVar3 = *xd->mi;
  if ((((pMVar3->mode == '\0') && ((pMVar3->palette_mode_info).palette_size[0] == '\0')) &&
      (uVar8 = (ulong)pMVar3->bsize, uVar8 != 0xff)) &&
     (((cm->seq_params->enable_filter_intra != '\0' && ((0x1f07ffUL >> (uVar8 & 0x3f) & 1) != 0)) &&
      ((0x2f0bffUL >> (uVar8 & 0x3f) & 1) != 0)))) {
    pFVar4 = xd->tile_ctx;
    icdf_00 = pFVar4->filter_intra_cdfs + uVar8;
    iVar7 = od_ec_decode_cdf_q15(&r->ec,*icdf_00,2);
    uVar6 = (uint8_t)iVar7;
    if (r->allow_update_cdf != '\0') {
      uVar1 = pFVar4->filter_intra_cdfs[uVar8][2];
      bVar9 = (char)(uVar1 >> 4) + 4;
      uVar2 = (*icdf_00)[0];
      if ((char)uVar6 < '\x01') {
        sVar5 = -(uVar2 >> (bVar9 & 0x1f));
      }
      else {
        sVar5 = (short)((int)(0x8000 - (uint)uVar2) >> (bVar9 & 0x1f));
      }
      (*icdf_00)[0] = sVar5 + uVar2;
      pFVar4->filter_intra_cdfs[uVar8][2] = uVar1 + (uVar1 < 0x20);
    }
    (pMVar3->filter_intra_mode_info).use_filter_intra = uVar6;
    if (uVar6 != '\0') {
      pFVar4 = xd->tile_ctx;
      icdf = pFVar4->filter_intra_mode_cdf;
      iVar7 = od_ec_decode_cdf_q15(&r->ec,icdf,5);
      if (r->allow_update_cdf != '\0') {
        uVar1 = pFVar4->filter_intra_mode_cdf[5];
        bVar9 = (char)(uVar1 >> 4) + 5;
        lVar10 = 0;
        do {
          uVar2 = icdf[lVar10];
          if (lVar10 < (char)(FILTER_INTRA_MODE)iVar7) {
            sVar5 = (short)((int)(0x8000 - (uint)uVar2) >> (bVar9 & 0x1f));
          }
          else {
            sVar5 = -(uVar2 >> (bVar9 & 0x1f));
          }
          icdf[lVar10] = sVar5 + uVar2;
          lVar10 = lVar10 + 1;
        } while (lVar10 != 4);
        pFVar4->filter_intra_mode_cdf[5] = pFVar4->filter_intra_mode_cdf[5] + (ushort)(uVar1 < 0x20)
        ;
      }
      (pMVar3->filter_intra_mode_info).filter_intra_mode = (FILTER_INTRA_MODE)iVar7;
    }
  }
  else {
    (pMVar3->filter_intra_mode_info).use_filter_intra = '\0';
  }
  return;
}

Assistant:

static void read_filter_intra_mode_info(const AV1_COMMON *const cm,
                                        MACROBLOCKD *const xd, aom_reader *r) {
  MB_MODE_INFO *const mbmi = xd->mi[0];
  FILTER_INTRA_MODE_INFO *filter_intra_mode_info =
      &mbmi->filter_intra_mode_info;

  if (av1_filter_intra_allowed(cm, mbmi)) {
    filter_intra_mode_info->use_filter_intra = aom_read_symbol(
        r, xd->tile_ctx->filter_intra_cdfs[mbmi->bsize], 2, ACCT_STR);
    if (filter_intra_mode_info->use_filter_intra) {
      filter_intra_mode_info->filter_intra_mode = aom_read_symbol(
          r, xd->tile_ctx->filter_intra_mode_cdf, FILTER_INTRA_MODES, ACCT_STR);
    }
  } else {
    filter_intra_mode_info->use_filter_intra = 0;
  }
}